

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O3

void __thiscall
Engine_testConstructWithHandlerVector_Test::TestBody
          (Engine_testConstructWithHandlerVector_Test *this)

{
  __uniq_ptr_impl<Handler,_std::default_delete<Handler>_> _Var1;
  bool bVar2;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  handlers;
  Engine e;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  local_58;
  Engine local_40;
  
  local_58.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.prefix._M_dataplus._M_p = (pointer)operator_new(8);
  *(undefined ***)local_40.prefix._M_dataplus._M_p = &PTR_HandleMeasures_001b4280;
  std::
  vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
  ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
            ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              *)&local_58,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_40);
  if ((long *)local_40.prefix._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_40.prefix._M_dataplus._M_p + 0x18))();
  }
  local_40.prefix._M_dataplus._M_p = (pointer)operator_new(0x38);
  *(undefined ***)local_40.prefix._M_dataplus._M_p = &PTR_HandleMeasures_001b4120;
  *(size_type *)((long)local_40.prefix._M_dataplus._M_p + 8) = 0;
  *(size_type *)((long)local_40.prefix._M_dataplus._M_p + 0x10) = 0;
  *(size_type *)((long)local_40.prefix._M_dataplus._M_p + 0x18) = 0;
  *(size_type *)((long)local_40.prefix._M_dataplus._M_p + 0x20) = 0;
  *(size_type *)((long)local_40.prefix._M_dataplus._M_p + 0x28) = 0;
  *(size_type *)((long)local_40.prefix._M_dataplus._M_p + 0x30) = 0;
  std::
  vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
  ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
            ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              *)&local_58,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.prefix._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_40.prefix._M_dataplus._M_p + 0x18))();
  }
  Engine::Engine(&local_40,"foo",&local_58);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            (local_68,"\"foo\"","e.prefix",(char (*) [4])0x185245,&local_40.prefix);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_._0_4_ = 2;
    pvVar3 = Engine::GetHandlers(&local_40);
    local_78.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)(pvVar3->
                super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar3->
                super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_68,"2","e.GetHandlers().size()",(int *)&local_70,(unsigned_long *)&local_78);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x22,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      pvVar3 = Engine::GetHandlers(&local_40);
      _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
      super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
           (((pvVar3->
             super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
      if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
          _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
          super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
        local_70.data_ = (AssertHelperData *)0x0;
      }
      else {
        local_70.data_ =
             (AssertHelperData *)
             __dynamic_cast(_Var1._M_t.
                            super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                            super__Head_base<0UL,_Handler_*,_false>._M_head_impl,&Handler::typeinfo,
                            &PrintHandler::typeinfo,0);
      }
      testing::internal::CmpHelperNE<decltype(nullptr),PrintHandler*>
                (local_68,"nullptr","dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get())",
                 &local_78.ptr_,(PrintHandler **)&local_70);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_60.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                   ,0x23,pcVar4);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_78.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_78.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pvVar3 = Engine::GetHandlers(&local_40);
        _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
        super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
             (pvVar3->
             super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
             super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
        if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
            _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
            super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
          local_70.data_ = (AssertHelperData *)0x0;
        }
        else {
          local_70.data_ =
               (AssertHelperData *)
               __dynamic_cast(_Var1._M_t.
                              super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                              super__Head_base<0UL,_Handler_*,_false>._M_head_impl,
                              &Handler::typeinfo,&TestHandler::typeinfo,0);
        }
        testing::internal::CmpHelperNE<decltype(nullptr),TestHandler*>
                  (local_68,"nullptr","dynamic_cast<TestHandler *>(e.GetHandlers()[1].get())",
                   &local_78.ptr_,(TestHandler **)&local_70);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_78);
          if (local_60.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_60.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                     ,0x24,pcVar4);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_78.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_78.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::~vector(&local_40.handlers);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.prefix._M_dataplus._M_p != &local_40.prefix.field_2) {
    operator_delete(local_40.prefix._M_dataplus._M_p,
                    local_40.prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

TEST(Engine, testAddIntegerNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Add("foo", 100000000);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100000000, im.value);
    ASSERT_EQ(0, im.tags.size());
}